

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O2

void png_do_write_interlace(png_row_infop row_info,png_bytep row,int pass)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  png_bytep ppVar6;
  png_uint_32 row_width;
  png_byte pVar7;
  uint uVar8;
  uint uVar9;
  
  if (5 < pass) {
    return;
  }
  bVar1 = row_info->pixel_depth;
  uVar2 = row_info->width;
  ppVar6 = row;
  if (bVar1 == 4) {
    uVar3 = (uint)""[pass];
    uVar9 = 0;
    iVar4 = 4;
    for (uVar8 = (uint)""[pass]; pVar7 = (png_byte)uVar9, uVar8 < uVar2;
        uVar8 = uVar8 + "\b\b\x04\x04\x02\x02\x01"[pass]) {
      uVar9 = (row[uVar8 >> 1] >> (~((char)uVar8 * '\x04') & 4U) & 0xf) << ((byte)iVar4 & 0x1f) |
              uVar9;
      if (iVar4 == 0) {
        *ppVar6 = (png_byte)uVar9;
        ppVar6 = ppVar6 + 1;
        uVar9 = 0;
        iVar4 = 4;
      }
      else {
        iVar4 = iVar4 + -4;
      }
    }
    if (iVar4 == 4) goto LAB_00124181;
  }
  else if (bVar1 == 2) {
    uVar3 = (uint)""[pass];
    uVar9 = 0;
    iVar4 = 6;
    for (uVar8 = (uint)""[pass]; pVar7 = (png_byte)uVar9, uVar8 < uVar2;
        uVar8 = uVar8 + "\b\b\x04\x04\x02\x02\x01"[pass]) {
      uVar9 = (row[uVar8 >> 2] >> (~((char)uVar8 * '\x02') & 6U) & 3) << ((byte)iVar4 & 0x1f) |
              uVar9;
      if (iVar4 == 0) {
        *ppVar6 = (png_byte)uVar9;
        ppVar6 = ppVar6 + 1;
        uVar9 = 0;
        iVar4 = 6;
      }
      else {
        iVar4 = iVar4 + -2;
      }
    }
    if (iVar4 == 6) goto LAB_00124181;
  }
  else {
    if (bVar1 != 1) {
      uVar5 = (ulong)(bVar1 >> 3);
      uVar3 = (uint)""[pass];
      for (uVar8 = (uint)""[pass]; uVar8 < uVar2; uVar8 = uVar8 + "\b\b\x04\x04\x02\x02\x01"[pass])
      {
        if (ppVar6 != row + uVar8 * uVar5) {
          memcpy(ppVar6,row + uVar8 * uVar5,uVar5);
        }
        ppVar6 = ppVar6 + uVar5;
      }
      goto LAB_00124181;
    }
    uVar3 = (uint)""[pass];
    uVar9 = 0;
    iVar4 = 7;
    for (uVar8 = (uint)""[pass]; pVar7 = (png_byte)uVar9, uVar8 < uVar2;
        uVar8 = uVar8 + "\b\b\x04\x04\x02\x02\x01"[pass]) {
      uVar9 = (uint)((row[uVar8 >> 3] >> (~(byte)uVar8 & 7) & 1) != 0) << ((byte)iVar4 & 0x1f) |
              uVar9;
      if (iVar4 == 0) {
        *ppVar6 = (png_byte)uVar9;
        ppVar6 = ppVar6 + 1;
        uVar9 = 0;
        iVar4 = 7;
      }
      else {
        iVar4 = iVar4 + -1;
      }
    }
    if (iVar4 == 7) goto LAB_00124181;
  }
  *ppVar6 = pVar7;
LAB_00124181:
  uVar5 = (ulong)(~uVar3 + row_info->width + (uint)"\b\b\x04\x04\x02\x02\x01"[pass]) /
          (ulong)(uint)"\b\b\x04\x04\x02\x02\x01"[pass];
  row_info->width = (png_uint_32)uVar5;
  bVar1 = row_info->pixel_depth;
  if ((ulong)bVar1 < 8) {
    uVar5 = bVar1 * uVar5 + 7 >> 3;
  }
  else {
    uVar5 = (bVar1 >> 3) * uVar5;
  }
  row_info->rowbytes = uVar5;
  return;
}

Assistant:

void /* PRIVATE */
png_do_write_interlace(png_row_infop row_info, png_bytep row, int pass)
{
   /* Arrays to facilitate easy interlacing - use pass (0 - 6) as index */

   /* Start of interlace block */
   static const png_byte png_pass_start[7] = {0, 4, 0, 2, 0, 1, 0};

   /* Offset to next interlace block */
   static const png_byte png_pass_inc[7] = {8, 8, 4, 4, 2, 2, 1};

   png_debug(1, "in png_do_write_interlace");

   /* We don't have to do anything on the last pass (6) */
   if (pass < 6)
   {
      /* Each pixel depth is handled separately */
      switch (row_info->pixel_depth)
      {
         case 1:
         {
            png_bytep sp;
            png_bytep dp;
            unsigned int shift;
            int d;
            int value;
            png_uint_32 i;
            png_uint_32 row_width = row_info->width;

            dp = row;
            d = 0;
            shift = 7;

            for (i = png_pass_start[pass]; i < row_width;
               i += png_pass_inc[pass])
            {
               sp = row + (size_t)(i >> 3);
               value = (int)(*sp >> (7 - (int)(i & 0x07))) & 0x01;
               d |= (value << shift);

               if (shift == 0)
               {
                  shift = 7;
                  *dp++ = (png_byte)d;
                  d = 0;
               }

               else
                  shift--;

            }
            if (shift != 7)
               *dp = (png_byte)d;

            break;
         }

         case 2:
         {
            png_bytep sp;
            png_bytep dp;
            unsigned int shift;
            int d;
            int value;
            png_uint_32 i;
            png_uint_32 row_width = row_info->width;

            dp = row;
            shift = 6;
            d = 0;

            for (i = png_pass_start[pass]; i < row_width;
               i += png_pass_inc[pass])
            {
               sp = row + (size_t)(i >> 2);
               value = (*sp >> ((3 - (int)(i & 0x03)) << 1)) & 0x03;
               d |= (value << shift);

               if (shift == 0)
               {
                  shift = 6;
                  *dp++ = (png_byte)d;
                  d = 0;
               }

               else
                  shift -= 2;
            }
            if (shift != 6)
               *dp = (png_byte)d;

            break;
         }

         case 4:
         {
            png_bytep sp;
            png_bytep dp;
            unsigned int shift;
            int d;
            int value;
            png_uint_32 i;
            png_uint_32 row_width = row_info->width;

            dp = row;
            shift = 4;
            d = 0;
            for (i = png_pass_start[pass]; i < row_width;
                i += png_pass_inc[pass])
            {
               sp = row + (size_t)(i >> 1);
               value = (*sp >> ((1 - (int)(i & 0x01)) << 2)) & 0x0f;
               d |= (value << shift);

               if (shift == 0)
               {
                  shift = 4;
                  *dp++ = (png_byte)d;
                  d = 0;
               }

               else
                  shift -= 4;
            }
            if (shift != 4)
               *dp = (png_byte)d;

            break;
         }

         default:
         {
            png_bytep sp;
            png_bytep dp;
            png_uint_32 i;
            png_uint_32 row_width = row_info->width;
            size_t pixel_bytes;

            /* Start at the beginning */
            dp = row;

            /* Find out how many bytes each pixel takes up */
            pixel_bytes = (row_info->pixel_depth >> 3);

            /* Loop through the row, only looking at the pixels that matter */
            for (i = png_pass_start[pass]; i < row_width;
               i += png_pass_inc[pass])
            {
               /* Find out where the original pixel is */
               sp = row + (size_t)i * pixel_bytes;

               /* Move the pixel */
               if (dp != sp)
                  memcpy(dp, sp, pixel_bytes);

               /* Next pixel */
               dp += pixel_bytes;
            }
            break;
         }
      }
      /* Set new row width */
      row_info->width = (row_info->width +
          png_pass_inc[pass] - 1 -
          png_pass_start[pass]) /
          png_pass_inc[pass];

      row_info->rowbytes = PNG_ROWBYTES(row_info->pixel_depth,
          row_info->width);
   }
}